

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O2

bool __thiscall BinarySearchTree::insert(BinarySearchTree *this,Node *node,Node *newNode)

{
  byte bVar1;
  Node *pNVar2;
  byte bVar3;
  
  bVar3 = 0;
  while( true ) {
    bVar1 = bVar3;
    pNVar2 = node;
    if (this->root == (Node *)0x0) {
      pNVar2 = (Node *)operator_new(0x18);
      this->root = pNVar2;
      pNVar2->value = newNode->value;
      pNVar2->leftChild = (Node *)0x0;
      pNVar2->rightChild = (Node *)0x0;
      bVar3 = 1;
      bVar1 = 0;
      goto LAB_00106974;
    }
    if (pNVar2->value == newNode->value) break;
    if (newNode->value < pNVar2->value) {
      node = pNVar2->leftChild;
      bVar3 = 1;
      if (pNVar2->leftChild == (Node *)0x0) {
        pNVar2->leftChild = newNode;
        newNode->leftChild = (Node *)0x0;
        pNVar2->leftChild->rightChild = (Node *)0x0;
        goto LAB_00106972;
      }
    }
    else {
      node = pNVar2->rightChild;
      bVar3 = 1;
      if (pNVar2->rightChild == (Node *)0x0) {
        pNVar2->rightChild = newNode;
        newNode->leftChild = (Node *)0x0;
        newNode->rightChild = (Node *)0x0;
LAB_00106972:
        bVar3 = 1;
LAB_00106974:
        return (bool)((bVar1 ^ 1) & bVar3);
      }
    }
  }
  bVar3 = 0;
  goto LAB_00106974;
}

Assistant:

bool BinarySearchTree::insert(Node *node, Node *newNode) {
    if (root == nullptr) {
        root = new Node;
        root->value = newNode->value;
        root->leftChild = nullptr;
        root->rightChild = nullptr;
        //  std::cout << "Root Node is Added" << std::endl;
        return true;
    }
    if (node->value == newNode->value) {
        //  std::cout << "Element already in the tree" << std::endl;
        return false;
    }
    if (node->value > newNode->value) {
        if (node->leftChild != nullptr) {
            insert(node->leftChild, newNode);
        } else {
            node->leftChild = newNode;
            (node->leftChild)->leftChild = nullptr;
            (node->leftChild)->rightChild = nullptr;
            //  std::cout << "Node Added To Left" << std::endl;
            return true;
        }
    } else {
        if (node->rightChild != nullptr) {
            insert(node->rightChild, newNode);
        } else {
            node->rightChild = newNode;
            (node->rightChild)->leftChild = nullptr;
            (node->rightChild)->rightChild = nullptr;
            //  std::cout << "Node Added To Right" << std::endl;
            return true;
        }
    }
    return false;
}